

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O2

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(DynamicRectMatrix<double> *this,SelfType *m)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  uint i;
  ulong uVar5;
  uint j;
  ulong uVar6;
  
  allocate(this,m->nrow_,m->ncol_);
  uVar1 = this->nrow_;
  uVar2 = this->ncol_;
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    ppdVar3 = m->data_;
    ppdVar4 = this->data_;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      ppdVar4[uVar5][uVar6] = ppdVar3[uVar5][uVar6];
    }
  }
  return;
}

Assistant:

DynamicRectMatrix(const SelfType& m) {
      allocate(m.getNRow(), m.getNCol());

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = m.data_[i][j];
    }